

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

vec<4UL,_double> * __thiscall
mat<4UL,_4UL>::col(vec<4UL,_double> *__return_storage_ptr__,mat<4UL,_4UL> *this,size_t idx)

{
  double *pdVar1;
  double dVar2;
  size_t local_20;
  size_t i;
  size_t idx_local;
  mat<4UL,_4UL> *this_local;
  
  if (idx < 4) {
    vec<4UL,_double>::vec(__return_storage_ptr__);
    local_20 = 4;
    while (local_20 != 0) {
      dVar2 = vec<4UL,_double>::operator[](this->rows + (local_20 - 1),idx);
      pdVar1 = vec<4UL,_double>::operator[](__return_storage_ptr__,local_20 - 1);
      *pdVar1 = dVar2;
      local_20 = local_20 - 1;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xb5,"vec<nrows, double> mat<4, 4>::col(const size_t) const [nrows = 4, ncols = 4]"
               );
}

Assistant:

vec<nrows, double> col(const size_t idx) const
    {
        assert(idx >= 0 && idx < ncols);
        vec<nrows, double> ret;
        for (size_t i = nrows; i--; ret[i] = rows[i][idx])
            ;
        return ret;
    }